

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_2d_scale_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  CONV_BUF_TYPE *pCVar4;
  int x;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  undefined2 *puVar14;
  long lVar15;
  uint uVar16;
  uint8_t *puVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int x_qn;
  short *psVar22;
  ulong uVar23;
  undefined2 auStack_10c38 [34308];
  
  uVar1 = filter_params_y->taps;
  uVar21 = ((h + -1) * y_step_qn + subpel_y_qn >> 10) + (uint)uVar1;
  iVar11 = conv_params->round_1;
  bVar7 = (byte)conv_params->round_0;
  iVar10 = (uVar1 >> 1) - 1;
  uVar2 = filter_params_x->taps;
  uVar23 = 0;
  uVar19 = 0;
  if (0 < w) {
    uVar19 = (ulong)(uint)w;
  }
  uVar9 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    uVar9 = uVar23;
  }
  puVar17 = src + (1 - ((long)(iVar10 * src_stride) + (ulong)(uVar2 >> 1)));
  pCVar4 = conv_params->dst;
  iVar3 = conv_params->dst_stride;
  lVar15 = (long)w;
  for (; uVar23 != uVar9; uVar23 = uVar23 + 1) {
    uVar21 = subpel_x_qn;
    for (uVar5 = 0; uVar5 != uVar19; uVar5 = uVar5 + 1) {
      iVar18 = 0x4000;
      for (uVar20 = 0; uVar2 != uVar20; uVar20 = uVar20 + 1) {
        iVar18 = iVar18 + (uint)puVar17[uVar20 + (long)((int)uVar21 >> 10)] *
                          (int)*(short *)((long)filter_params_x->filter_ptr +
                                         uVar20 * 2 + (ulong)((uVar21 >> 6 & 0xf) * (uint)uVar2 * 2)
                                         );
      }
      auStack_10c38[uVar5 + uVar23 * lVar15] =
           (short)(iVar18 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f));
      uVar21 = uVar21 + x_step_qn;
    }
    puVar17 = puVar17 + src_stride;
  }
  bVar6 = 0xe - ((char)iVar11 + bVar7);
  bVar7 = 0x16 - bVar7;
  iVar11 = (1 << (bVar6 & 0x1f)) >> 1;
  uVar23 = (ulong)(uint)h;
  if (h < 1) {
    uVar23 = 0;
  }
  puVar14 = auStack_10c38 + (1 - (ulong)(uVar1 >> 1)) * lVar15 + (long)(iVar10 * w);
  uVar9 = 0;
  do {
    if (uVar9 == uVar19) {
      return;
    }
    uVar21 = subpel_y_qn;
    for (uVar5 = 0; uVar5 != uVar23; uVar5 = uVar5 + 1) {
      psVar22 = puVar14 + ((int)uVar21 >> 10) * w;
      iVar10 = 1 << (bVar7 & 0x1f);
      for (uVar20 = 0; filter_params_y->taps != uVar20; uVar20 = uVar20 + 1) {
        iVar10 = iVar10 + (int)*psVar22 *
                          (int)*(short *)((long)filter_params_y->filter_ptr +
                                         uVar20 * 2 +
                                         (ulong)((uVar21 >> 6 & 0xf) * (uint)filter_params_y->taps *
                                                2));
        psVar22 = psVar22 + lVar15;
      }
      bVar8 = (byte)conv_params->round_1;
      uVar16 = ((1 << (bVar8 & 0x1f)) >> 1) + iVar10 >> (bVar8 & 0x1f);
      if (conv_params->is_compound == 0) {
        iVar10 = (-1 << (bVar7 - bVar8 & 0x1f)) + iVar11 + (-1 << ((bVar7 - bVar8) - 1 & 0x1f)) +
                 (uVar16 & 0xffff);
LAB_0032aabf:
        iVar10 = iVar10 >> (bVar6 & 0x1f);
        if (iVar10 < 1) {
          iVar10 = 0;
        }
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        dst[uVar5 * (long)dst_stride + uVar9] = (uint8_t)iVar10;
      }
      else {
        lVar13 = uVar5 * (long)iVar3;
        if (conv_params->do_average != 0) {
          uVar12 = (uint)pCVar4[uVar9 + lVar13];
          if (conv_params->use_dist_wtd_comp_avg == 0) {
            uVar16 = (uVar16 & 0xffff) + uVar12 >> 1;
          }
          else {
            uVar16 = (int)((uVar16 & 0xffff) * conv_params->bck_offset +
                          uVar12 * conv_params->fwd_offset) >> 4;
          }
          iVar10 = (-1 << (bVar7 - bVar8 & 0x1f)) + iVar11 + (-1 << ((bVar7 - bVar8) - 1 & 0x1f)) +
                   uVar16;
          goto LAB_0032aabf;
        }
        pCVar4[uVar9 + lVar13] = (CONV_BUF_TYPE)uVar16;
      }
      uVar21 = uVar21 + y_step_qn;
    }
    uVar9 = uVar9 + 1;
    puVar14 = puVar14 + 1;
  } while( true );
}

Assistant:

void av1_convolve_2d_scale_c(const uint8_t *src, int src_stride, uint8_t *dst,
                             int dst_stride, int w, int h,
                             const InterpFilterParams *filter_params_x,
                             const InterpFilterParams *filter_params_y,
                             const int subpel_x_qn, const int x_step_qn,
                             const int subpel_y_qn, const int y_step_qn,
                             ConvolveParams *conv_params) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint8_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(tmp, bits));
      }
    }
    src_vert++;
  }
}